

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O1

void __thiscall
duckdb::TupleDataAllocator::InitializeChunkStateInternal
          (TupleDataAllocator *this,TupleDataPinState *pin_state,TupleDataChunkState *chunk_state,
          idx_t offset,bool recompute,bool init_heap_pointers,bool init_heap_sizes,
          unsafe_vector<reference<TupleDataChunkPart>_> *parts)

{
  uint uVar1;
  pointer prVar2;
  data_ptr_t *row_locations;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  TupleDataChunkPart *part;
  idx_t iVar5;
  pthread_mutex_t *__mutex;
  int iVar6;
  BufferHandle *pBVar7;
  data_ptr_t pdVar8;
  SelectionVector *old_heap_sel;
  long lVar9;
  ulong uVar10;
  ulong count;
  long lVar11;
  pointer prVar12;
  Vector new_heap_ptrs;
  Vector old_heap_ptrs;
  Value local_70;
  
  prVar12 = (parts->
            super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
            ).
            super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  prVar2 = (parts->
           super_vector<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::TupleDataChunkPart>,_std::allocator<std::reference_wrapper<duckdb::TupleDataChunkPart>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (prVar12 != prVar2) {
    row_locations = (data_ptr_t *)(chunk_state->row_locations).data;
    pdVar3 = (chunk_state->heap_locations).data;
    pdVar4 = (chunk_state->heap_sizes).data;
    do {
      part = prVar12->_M_data;
      uVar1 = part->count;
      count = (ulong)uVar1;
      iVar5 = this->layout->row_width;
      pBVar7 = PinRowBlock(this,pin_state,part);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar7->node);
      if (count != 0) {
        pdVar8 = ((pBVar7->node).ptr)->buffer + part->row_block_offset;
        uVar10 = 0;
        do {
          row_locations[offset + uVar10] = pdVar8;
          uVar10 = uVar10 + 1;
          pdVar8 = pdVar8 + iVar5;
        } while (count != uVar10);
      }
      if (this->layout->all_constant == false) {
        if (part->total_heap_size == 0) {
          if ((init_heap_sizes) && (count != 0)) {
            iVar5 = this->layout->heap_size_offset;
            uVar10 = 0;
            do {
              *(ulong *)(pdVar4 + uVar10 * 8 + offset * 8) =
                   (ulong)*(uint *)(row_locations[offset + uVar10] + iVar5);
              uVar10 = uVar10 + 1;
            } while (count != uVar10);
          }
        }
        else {
          if ((recompute) && (pin_state->properties != ALREADY_PINNED)) {
            pBVar7 = PinHeapBlock(this,pin_state,part);
            optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&pBVar7->node);
            pdVar8 = ((pBVar7->node).ptr)->buffer;
            if (part->base_heap_ptr != pdVar8) {
              __mutex = (pthread_mutex_t *)(part->lock)._M_data;
              iVar6 = pthread_mutex_lock(__mutex);
              if (iVar6 != 0) {
                ::std::__throw_system_error(iVar6);
              }
              if (part->base_heap_ptr != pdVar8) {
                Value::POINTER((Value *)&new_heap_ptrs,
                               (uintptr_t)(part->base_heap_ptr + part->heap_block_offset));
                Vector::Vector(&old_heap_ptrs,(Value *)&new_heap_ptrs);
                Value::~Value((Value *)&new_heap_ptrs);
                Value::POINTER(&local_70,(uintptr_t)(pdVar8 + part->heap_block_offset));
                Vector::Vector(&new_heap_ptrs,&local_70);
                Value::~Value(&local_70);
                old_heap_sel = ConstantVector::ZeroSelectionVector();
                RecomputeHeapPointers
                          (&old_heap_ptrs,old_heap_sel,row_locations,&new_heap_ptrs,offset,count,
                           this->layout,0);
                part->base_heap_ptr = pdVar8;
                if (new_heap_ptrs.auxiliary.internal.
                    super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (new_heap_ptrs.auxiliary.internal.
                             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (new_heap_ptrs.buffer.internal.
                    super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (new_heap_ptrs.buffer.internal.
                             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (new_heap_ptrs.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (new_heap_ptrs.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                LogicalType::~LogicalType(&new_heap_ptrs.type);
                if (old_heap_ptrs.auxiliary.internal.
                    super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (old_heap_ptrs.auxiliary.internal.
                             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (old_heap_ptrs.buffer.internal.
                    super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (old_heap_ptrs.buffer.internal.
                             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (old_heap_ptrs.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (old_heap_ptrs.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                LogicalType::~LogicalType(&old_heap_ptrs.type);
              }
              pthread_mutex_unlock(__mutex);
            }
          }
          if ((init_heap_sizes) && (count != 0)) {
            iVar5 = this->layout->heap_size_offset;
            uVar10 = 0;
            do {
              *(ulong *)(pdVar4 + uVar10 * 8 + offset * 8) =
                   (ulong)*(uint *)(row_locations[offset + uVar10] + iVar5);
              uVar10 = uVar10 + 1;
            } while (count != uVar10);
          }
          if ((init_heap_pointers) &&
             (*(data_ptr_t *)(pdVar3 + offset * 8) = part->base_heap_ptr + part->heap_block_offset,
             1 < uVar1)) {
            lVar9 = *(long *)(pdVar3 + offset * 8);
            lVar11 = 0;
            do {
              lVar9 = lVar9 + *(long *)(pdVar4 + lVar11 * 8 + offset * 8);
              *(long *)(pdVar3 + lVar11 * 8 + offset * 8 + 8) = lVar9;
              lVar11 = lVar11 + 1;
            } while (count - 1 != lVar11);
          }
        }
      }
      offset = offset + count;
      prVar12 = prVar12 + 1;
    } while (prVar12 != prVar2);
  }
  return;
}

Assistant:

void TupleDataAllocator::InitializeChunkStateInternal(TupleDataPinState &pin_state, TupleDataChunkState &chunk_state,
                                                      idx_t offset, bool recompute, bool init_heap_pointers,
                                                      bool init_heap_sizes,
                                                      unsafe_vector<reference<TupleDataChunkPart>> &parts) {
	auto row_locations = FlatVector::GetData<data_ptr_t>(chunk_state.row_locations);
	auto heap_sizes = FlatVector::GetData<idx_t>(chunk_state.heap_sizes);
	auto heap_locations = FlatVector::GetData<data_ptr_t>(chunk_state.heap_locations);

	for (auto &part_ref : parts) {
		auto &part = part_ref.get();
		const auto next = part.count;

		// Set up row locations for the scan
		const auto row_width = layout.GetRowWidth();
		const auto base_row_ptr = GetRowPointer(pin_state, part);
		for (idx_t i = 0; i < next; i++) {
			row_locations[offset + i] = base_row_ptr + i * row_width;
		}

		if (layout.AllConstant()) { // Can't have a heap
			offset += next;
			continue;
		}

		if (part.total_heap_size == 0) {
			if (init_heap_sizes) { // No heap, but we need the heap sizes
				InitializeHeapSizes(row_locations, heap_sizes, offset, next, part, layout.GetHeapSizeOffset());
			}
			offset += next;
			continue;
		}

		// Check if heap block has changed - re-compute the pointers within each row if so
		if (recompute && pin_state.properties != TupleDataPinProperties::ALREADY_PINNED) {
			const auto new_base_heap_ptr = GetBaseHeapPointer(pin_state, part);
			if (part.base_heap_ptr != new_base_heap_ptr) {
				lock_guard<mutex> guard(part.lock);
				const auto old_base_heap_ptr = part.base_heap_ptr;
				if (old_base_heap_ptr != new_base_heap_ptr) {
					Vector old_heap_ptrs(
					    Value::POINTER(CastPointerToValue(old_base_heap_ptr + part.heap_block_offset)));
					Vector new_heap_ptrs(
					    Value::POINTER(CastPointerToValue(new_base_heap_ptr + part.heap_block_offset)));
					RecomputeHeapPointers(old_heap_ptrs, *ConstantVector::ZeroSelectionVector(), row_locations,
					                      new_heap_ptrs, offset, next, layout, 0);
					part.base_heap_ptr = new_base_heap_ptr;
				}
			}
		}

		if (init_heap_sizes) {
			InitializeHeapSizes(row_locations, heap_sizes, offset, next, part, layout.GetHeapSizeOffset());
		}

		if (init_heap_pointers) {
			// Set the pointers where the heap data will be written (if needed)
			heap_locations[offset] = part.base_heap_ptr + part.heap_block_offset;
			for (idx_t i = 1; i < next; i++) {
				auto idx = offset + i;
				heap_locations[idx] = heap_locations[idx - 1] + heap_sizes[idx - 1];
			}
		}

		offset += next;
	}
	D_ASSERT(offset <= STANDARD_VECTOR_SIZE);
}